

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void nni_listener_reap(nni_listener *l)

{
  nni_listener *l_local;
  
  nni_reap(&listener_reap_list,l);
  return;
}

Assistant:

static void
listener_reap(void *arg)
{
	nni_listener *l = arg;
	nni_sock     *s = l->l_sock;

#ifdef NNG_ENABLE_STATS
	nni_stat_unregister(&l->st_root);
#endif

	nni_mtx_lock(&s->s_mx);
	if (!nni_list_empty(&l->l_pipes)) {
		nni_pipe *p;
		// This should already have been done, but be certain!
		NNI_LIST_FOREACH (&l->l_pipes, p) {
			nni_pipe_close(p);
		}
		nni_mtx_unlock(&s->s_mx);
		// Go back to the end of reap list.
		nni_reap(&listener_reap_list, l);
		return;
	}

	nni_list_node_remove(&l->l_node);
	nni_mtx_unlock(&s->s_mx);

	nni_sock_rele(s);

	nni_listener_destroy(l);
}